

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPTransporter.h
# Opt level: O0

void __thiscall jaegertracing::utils::HTTPTransporter::~HTTPTransporter(HTTPTransporter *this)

{
  int in_ESI;
  HTTPTransporter *this_local;
  
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__HTTPTransporter_00519e18;
  Transport::close(&this->super_Transport,in_ESI);
  std::shared_ptr<apache::thrift::protocol::TProtocol>::~shared_ptr(&this->_protocol);
  std::shared_ptr<apache::thrift::transport::THttpClient>::~shared_ptr(&this->_httpClient);
  std::shared_ptr<apache::thrift::transport::TMemoryBuffer>::~shared_ptr(&this->_buffer);
  Transport::~Transport(&this->super_Transport);
  return;
}

Assistant:

~HTTPTransporter() { close(); }